

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

void lys_compile_mandatory_parents(lysc_node *parent,ly_bool add)

{
  bool bVar1;
  lysc_node *local_20;
  lysc_node *iter;
  lysc_node *plStack_10;
  ly_bool add_local;
  lysc_node *parent_local;
  
  plStack_10 = parent;
  if (add == '\0') {
    while( true ) {
      bVar1 = false;
      if ((plStack_10 != (lysc_node *)0x0) && (bVar1 = false, plStack_10->nodetype == 1)) {
        bVar1 = (plStack_10->flags & 0x20) != 0;
      }
      if (!bVar1) break;
      for (local_20 = lysc_node_child(plStack_10); local_20 != (lysc_node *)0x0;
          local_20 = local_20->next) {
        if ((local_20->flags & 0x20) != 0) {
          return;
        }
      }
      plStack_10->flags = plStack_10->flags & 0xffdf;
      plStack_10 = plStack_10->parent;
    }
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((plStack_10 != (lysc_node *)0x0) && (bVar1 = false, plStack_10->nodetype == 1)) &&
         (bVar1 = false, (plStack_10->flags & 0x20) == 0)) {
        bVar1 = (plStack_10->flags & 0x80) == 0;
      }
      if (!bVar1) break;
      plStack_10->flags = plStack_10->flags | 0x20;
      plStack_10 = plStack_10->parent;
    }
  }
  return;
}

Assistant:

void
lys_compile_mandatory_parents(struct lysc_node *parent, ly_bool add)
{
    const struct lysc_node *iter;

    if (add) { /* set flag */
        for ( ; parent && parent->nodetype == LYS_CONTAINER && !(parent->flags & LYS_MAND_TRUE) && !(parent->flags & LYS_PRESENCE);
                parent = parent->parent) {
            parent->flags |= LYS_MAND_TRUE;
        }
    } else { /* unset flag */
        for ( ; parent && parent->nodetype == LYS_CONTAINER && (parent->flags & LYS_MAND_TRUE); parent = parent->parent) {
            for (iter = lysc_node_child(parent); iter; iter = iter->next) {
                if (iter->flags & LYS_MAND_TRUE) {
                    /* there is another mandatory node */
                    return;
                }
            }
            /* unset mandatory flag - there is no mandatory children in the non-presence container */
            parent->flags &= ~LYS_MAND_TRUE;
        }
    }
}